

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O3

int __thiscall helics::TimeCoordinator::getIntegerProperty(TimeCoordinator *this,int intProperty)

{
  int iVar1;
  
  if (intProperty == 0x102) {
    iVar1 = (this->iteration).super___atomic_base<int>._M_i;
  }
  else {
    iVar1 = -0x3cc;
    if (intProperty == 0x103) {
      return (this->info).maxIterations;
    }
  }
  return iVar1;
}

Assistant:

int TimeCoordinator::getIntegerProperty(int intProperty) const
{
    switch (intProperty) {  // NOLINT
        case defs::Properties::MAX_ITERATIONS:
            return info.maxIterations;
        case defs::Properties::CURRENT_ITERATION:
            return iteration.load();
        default:
            return HELICS_INVALID_PROPERTY_VALUE;
    }
}